

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_Target * GPU_GetWindowTarget(Uint32 windowID)

{
  int local_18;
  int i;
  Uint32 windowID_local;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    gpu_init_window_mappings();
  }
  if (windowID != 0) {
    for (local_18 = 0; local_18 < _gpu_num_window_mappings; local_18 = local_18 + 1) {
      if (_gpu_window_mappings[local_18].windowID == windowID) {
        return _gpu_window_mappings[local_18].target;
      }
    }
  }
  return (GPU_Target *)0x0;
}

Assistant:

GPU_Target* GPU_GetWindowTarget(Uint32 windowID)
{
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(windowID == 0)  // Invalid window ID
        return NULL;

    // Find the occurrence
    for(i = 0; i < _gpu_num_window_mappings; ++i)
    {
        if(_gpu_window_mappings[i].windowID == windowID)
            return _gpu_window_mappings[i].target;
    }

    return NULL;
}